

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

bool google::protobuf::EnumDescriptorProto::IsInitializedImpl(MessageLite *msg)

{
  bool bVar1;
  RepeatedPtrField<google::protobuf::EnumValueDescriptorProto> *t;
  uint32_t *puVar2;
  EnumDescriptorProto *this_;
  MessageLite *msg_local;
  
  t = _internal_value((EnumDescriptorProto *)msg);
  bVar1 = internal::AllAreInitialized<google::protobuf::EnumValueDescriptorProto>(t);
  if (bVar1) {
    puVar2 = internal::HasBits<1>::operator[]((HasBits<1> *)(msg + 1),0);
    if (((*puVar2 & 2) == 0) ||
       (bVar1 = EnumOptions::IsInitialized((EnumOptions *)msg[6]._internal_metadata_.ptr_), bVar1))
    {
      msg_local._7_1_ = true;
    }
    else {
      msg_local._7_1_ = false;
    }
  }
  else {
    msg_local._7_1_ = false;
  }
  return msg_local._7_1_;
}

Assistant:

PROTOBUF_NOINLINE bool EnumDescriptorProto::IsInitializedImpl(
    const MessageLite& msg) {
  auto& this_ = static_cast<const EnumDescriptorProto&>(msg);
  if (!::google::protobuf::internal::AllAreInitialized(this_._internal_value()))
    return false;
  if ((this_._impl_._has_bits_[0] & 0x00000002u) != 0) {
    if (!this_._impl_.options_->IsInitialized()) return false;
  }
  return true;
}